

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

void embree::sse2::SphereMiMBIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  RayQueryContext *pRVar17;
  int iVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  ulong uVar21;
  RTCFilterFunctionN p_Var22;
  RayHitK<4> *pRVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  Scene *pSVar30;
  undefined1 auVar31 [8];
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  uint uVar39;
  float fVar49;
  float fVar51;
  float fVar53;
  undefined1 auVar40 [16];
  uint uVar50;
  uint uVar52;
  uint uVar54;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar55;
  float fVar72;
  float fVar74;
  float fVar76;
  undefined1 auVar57 [16];
  uint uVar56;
  uint uVar73;
  uint uVar75;
  uint uVar77;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  uint uVar91;
  float fVar95;
  float fVar97;
  undefined1 auVar92 [16];
  uint uVar96;
  uint uVar98;
  float fVar99;
  uint uVar100;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar104;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar105;
  undefined1 auVar103 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined4 uVar112;
  undefined4 uVar113;
  undefined4 uVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<4> h;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 (*local_208) [16];
  Scene *local_200;
  RTCFilterFunctionNArguments local_1f8;
  float local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  float local_1b8 [4];
  float local_1a8 [4];
  float local_198 [4];
  float local_188 [4];
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  RayQueryContext *local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  uint local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_200 = context->scene;
  uVar91 = sphere->sharedGeomID;
  uVar21 = (ulong)(sphere->primIDs).field_0.i[0];
  pGVar9 = (local_200->geometries).items[uVar91].ptr;
  local_228 = pGVar9->fnumTimeSegments;
  fVar36 = (pGVar9->time_range).lower;
  fVar36 = ((*(float *)(ray + k * 4 + 0x70) - fVar36) / ((pGVar9->time_range).upper - fVar36)) *
           local_228;
  _local_218 = ZEXT416((uint)fVar36);
  local_140 = context;
  fVar36 = floorf(fVar36);
  pRVar17 = local_140;
  if (local_228 + -1.0 <= fVar36) {
    fVar36 = local_228 + -1.0;
  }
  fVar118 = 0.0;
  if (0.0 <= fVar36) {
    fVar118 = fVar36;
  }
  fVar108 = (float)local_218._0_4_ - fVar118;
  lVar26 = *(long *)&pGVar9[2].numPrimitives;
  lVar24 = (long)(int)fVar118 * 0x38;
  lVar10 = *(long *)(lVar26 + lVar24);
  lVar11 = *(long *)(lVar26 + 0x10 + lVar24);
  pfVar1 = (float *)(lVar10 + lVar11 * uVar21);
  uVar25 = (ulong)(sphere->primIDs).field_0.i[1];
  pfVar2 = (float *)(lVar10 + lVar11 * uVar25);
  uVar27 = (ulong)(sphere->primIDs).field_0.i[2];
  pfVar3 = (float *)(lVar10 + lVar11 * uVar27);
  uVar29 = (ulong)(sphere->primIDs).field_0.i[3];
  pfVar4 = (float *)(lVar10 + lVar11 * uVar29);
  lVar10 = *(long *)(lVar26 + 0x38 + lVar24);
  lVar26 = *(long *)(lVar26 + 0x48 + lVar24);
  pfVar5 = (float *)(lVar10 + uVar21 * lVar26);
  pfVar6 = (float *)(lVar10 + uVar25 * lVar26);
  pfVar7 = (float *)(lVar10 + uVar27 * lVar26);
  pfVar8 = (float *)(lVar10 + lVar26 * uVar29);
  fVar37 = 1.0 - fVar108;
  fVar38 = fVar37 * pfVar1[3] + fVar108 * pfVar5[3];
  fVar49 = fVar37 * pfVar2[3] + fVar108 * pfVar6[3];
  fVar51 = fVar37 * pfVar3[3] + fVar108 * pfVar7[3];
  fVar53 = fVar37 * pfVar4[3] + fVar108 * pfVar8[3];
  uVar96 = (uint)sphere->numPrimitives;
  local_d8[0] = uVar91;
  local_d8[1] = uVar91;
  local_d8[2] = uVar91;
  local_d8[3] = uVar91;
  fVar36 = *(float *)(ray + k * 4);
  fVar118 = *(float *)(ray + k * 4 + 0x10);
  fVar125 = *(float *)(ray + k * 4 + 0x20);
  fVar119 = (*pfVar1 * fVar37 + *pfVar5 * fVar108) - fVar36;
  fVar120 = (*pfVar2 * fVar37 + *pfVar6 * fVar108) - fVar36;
  fVar121 = (*pfVar3 * fVar37 + *pfVar7 * fVar108) - fVar36;
  fVar36 = (*pfVar4 * fVar37 + *pfVar8 * fVar108) - fVar36;
  fVar115 = (pfVar1[1] * fVar37 + pfVar5[1] * fVar108) - fVar118;
  fVar116 = (pfVar2[1] * fVar37 + pfVar6[1] * fVar108) - fVar118;
  fVar117 = (pfVar3[1] * fVar37 + pfVar7[1] * fVar108) - fVar118;
  fVar118 = (pfVar4[1] * fVar37 + pfVar8[1] * fVar108) - fVar118;
  fVar122 = (pfVar1[2] * fVar37 + pfVar5[2] * fVar108) - fVar125;
  fVar123 = (pfVar2[2] * fVar37 + pfVar6[2] * fVar108) - fVar125;
  fVar124 = (pfVar3[2] * fVar37 + pfVar7[2] * fVar108) - fVar125;
  fVar125 = (pfVar4[2] * fVar37 + pfVar8[2] * fVar108) - fVar125;
  fVar37 = *(float *)(ray + k * 4 + 0x40);
  fVar108 = *(float *)(ray + k * 4 + 0x50);
  fVar126 = *(float *)(ray + k * 4 + 0x60);
  fVar89 = fVar108 * fVar108 + fVar126 * fVar126;
  auVar102._0_4_ = fVar37 * fVar37 + fVar89;
  auVar102._4_4_ = auVar102._0_4_;
  auVar102._8_4_ = auVar102._0_4_;
  auVar102._12_4_ = auVar102._0_4_;
  auVar92 = rcpps(ZEXT416((uint)fVar89),auVar102);
  fVar55 = auVar92._0_4_;
  fVar72 = auVar92._4_4_;
  fVar74 = auVar92._8_4_;
  fVar76 = auVar92._12_4_;
  fVar55 = (1.0 - auVar102._0_4_ * fVar55) * fVar55 + fVar55;
  fVar72 = (1.0 - auVar102._0_4_ * fVar72) * fVar72 + fVar72;
  fVar74 = (1.0 - auVar102._0_4_ * fVar74) * fVar74 + fVar74;
  fVar76 = (1.0 - auVar102._0_4_ * fVar76) * fVar76 + fVar76;
  fVar89 = (fVar119 * fVar37 + fVar115 * fVar108 + fVar122 * fVar126) * fVar55;
  fVar109 = (fVar120 * fVar37 + fVar116 * fVar108 + fVar123 * fVar126) * fVar72;
  fVar110 = (fVar121 * fVar37 + fVar117 * fVar108 + fVar124 * fVar126) * fVar74;
  fVar111 = (fVar36 * fVar37 + fVar118 * fVar108 + fVar125 * fVar126) * fVar76;
  fVar119 = fVar119 - fVar37 * fVar89;
  fVar120 = fVar120 - fVar37 * fVar109;
  fVar121 = fVar121 - fVar37 * fVar110;
  fVar36 = fVar36 - fVar37 * fVar111;
  fVar115 = fVar115 - fVar108 * fVar89;
  fVar116 = fVar116 - fVar108 * fVar109;
  fVar117 = fVar117 - fVar108 * fVar110;
  fVar118 = fVar118 - fVar108 * fVar111;
  fVar122 = fVar122 - fVar126 * fVar89;
  fVar123 = fVar123 - fVar126 * fVar109;
  fVar124 = fVar124 - fVar126 * fVar110;
  fVar125 = fVar125 - fVar126 * fVar111;
  auVar101._0_4_ = fVar115 * fVar115 + fVar122 * fVar122;
  auVar101._4_4_ = fVar116 * fVar116 + fVar123 * fVar123;
  auVar101._8_4_ = fVar117 * fVar117 + fVar124 * fVar124;
  auVar101._12_4_ = fVar118 * fVar118 + fVar125 * fVar125;
  fVar90 = fVar119 * fVar119 + auVar101._0_4_;
  fVar95 = fVar120 * fVar120 + auVar101._4_4_;
  fVar97 = fVar121 * fVar121 + auVar101._8_4_;
  fVar99 = fVar36 * fVar36 + auVar101._12_4_;
  fVar38 = fVar38 * fVar38;
  fVar49 = fVar49 * fVar49;
  fVar51 = fVar51 * fVar51;
  fVar53 = fVar53 * fVar53;
  bVar15 = uVar96 != 0 && fVar90 <= fVar38;
  auVar92._0_4_ = -(uint)bVar15;
  bVar16 = 1 < uVar96 && fVar95 <= fVar49;
  auVar92._4_4_ = -(uint)bVar16;
  bVar14 = 2 < uVar96 && fVar97 <= fVar51;
  auVar92._8_4_ = -(uint)bVar14;
  bVar13 = 3 < uVar96 && fVar99 <= fVar53;
  auVar92._12_4_ = -(uint)bVar13;
  iVar18 = movmskps(uVar96,auVar92);
  if (iVar18 != 0) {
    auVar57._0_4_ = fVar55 * (fVar38 - fVar90);
    auVar57._4_4_ = fVar72 * (fVar49 - fVar95);
    auVar57._8_4_ = fVar74 * (fVar51 - fVar97);
    auVar57._12_4_ = fVar76 * (fVar53 - fVar99);
    auVar102 = sqrtps(auVar101,auVar57);
    fVar51 = auVar102._0_4_;
    fVar74 = fVar89 - fVar51;
    fVar53 = auVar102._4_4_;
    fVar76 = fVar109 - fVar53;
    fVar55 = auVar102._8_4_;
    fVar90 = fVar110 - fVar55;
    fVar72 = auVar102._12_4_;
    fVar95 = fVar111 - fVar72;
    fVar89 = fVar89 + fVar51;
    fVar109 = fVar109 + fVar53;
    fVar110 = fVar110 + fVar55;
    fVar111 = fVar111 + fVar72;
    fVar38 = *(float *)(ray + k * 4 + 0x30);
    fVar49 = *(float *)(ray + k * 4 + 0x80);
    uVar112 = 0;
    uVar113 = 0;
    uVar114 = 0;
    uVar91 = -(uint)(fVar38 <= fVar74 && fVar74 <= fVar49);
    uVar96 = -(uint)(fVar38 <= fVar76 && fVar76 <= fVar49);
    uVar98 = -(uint)(fVar38 <= fVar90 && fVar90 <= fVar49);
    uVar100 = -(uint)(fVar38 <= fVar95 && fVar95 <= fVar49);
    uVar56 = uVar91 & auVar92._0_4_;
    uVar73 = uVar96 & auVar92._4_4_;
    auVar40._4_4_ = uVar73;
    auVar40._0_4_ = uVar56;
    uVar75 = uVar98 & auVar92._8_4_;
    uVar77 = uVar100 & auVar92._12_4_;
    auVar106._0_4_ = -(uint)((fVar38 <= fVar89 && fVar89 <= fVar49) && bVar15);
    auVar106._4_4_ = -(uint)((fVar38 <= fVar109 && fVar109 <= fVar49) && bVar16);
    auVar106._8_4_ = -(uint)((fVar38 <= fVar110 && fVar110 <= fVar49) && bVar14);
    auVar106._12_4_ = -(uint)((fVar38 <= fVar111 && fVar111 <= fVar49) && bVar13);
    auVar40._8_4_ = uVar75;
    auVar40._12_4_ = uVar77;
    local_248 = auVar40 | auVar106;
    iVar18 = movmskps(iVar18,local_248);
    if (iVar18 != 0) {
      local_1b8[0] = (float)((uint)fVar74 & uVar56 | ~uVar56 & (uint)fVar89);
      local_1b8[1] = (float)((uint)fVar76 & uVar73 | ~uVar73 & (uint)fVar109);
      local_1b8[2] = (float)((uint)fVar90 & uVar75 | ~uVar75 & (uint)fVar110);
      local_1b8[3] = (float)((uint)fVar95 & uVar77 | ~uVar77 & (uint)fVar111);
      fVar38 = (float)(~uVar56 & (uint)fVar51 | (uint)-fVar51 & uVar56);
      fVar51 = (float)(~uVar73 & (uint)fVar53 | (uint)-fVar53 & uVar73);
      fVar53 = (float)(~uVar75 & (uint)fVar55 | (uint)-fVar55 & uVar75);
      fVar55 = (float)(~uVar77 & (uint)fVar72 | (uint)-fVar72 & uVar77);
      local_1a8[0] = fVar37 * fVar38 - fVar119;
      local_1a8[1] = fVar37 * fVar51 - fVar120;
      local_1a8[2] = fVar37 * fVar53 - fVar121;
      local_1a8[3] = fVar37 * fVar55 - fVar36;
      local_198[0] = fVar108 * fVar38 - fVar115;
      local_198[1] = fVar108 * fVar51 - fVar116;
      local_198[2] = fVar108 * fVar53 - fVar117;
      local_198[3] = fVar108 * fVar55 - fVar118;
      local_188[0] = fVar38 * fVar126 - fVar122;
      local_188[1] = fVar51 * fVar126 - fVar123;
      local_188[2] = fVar53 * fVar126 - fVar124;
      local_188[3] = fVar55 * fVar126 - fVar125;
      local_218._4_4_ = local_1b8[1];
      local_218._0_4_ = local_1b8[0];
      fStack_210 = local_1b8[2];
      fStack_20c = local_1b8[3];
      uVar39 = local_248._0_4_;
      auVar58._0_4_ = (uint)local_1b8[0] & uVar39;
      uVar50 = local_248._4_4_;
      auVar58._4_4_ = (uint)local_1b8[1] & uVar50;
      uVar52 = local_248._8_4_;
      auVar58._8_4_ = (uint)local_1b8[2] & uVar52;
      uVar54 = local_248._12_4_;
      auVar58._12_4_ = (uint)local_1b8[3] & uVar54;
      auVar78._0_8_ = CONCAT44(~uVar50,~uVar39) & 0x7f8000007f800000;
      auVar78._8_4_ = ~uVar52 & 0x7f800000;
      auVar78._12_4_ = ~uVar54 & 0x7f800000;
      auVar78 = auVar78 | auVar58;
      auVar86._4_4_ = auVar78._0_4_;
      auVar86._0_4_ = auVar78._4_4_;
      auVar86._8_4_ = auVar78._12_4_;
      auVar86._12_4_ = auVar78._8_4_;
      auVar92 = minps(auVar86,auVar78);
      auVar59._0_8_ = auVar92._8_8_;
      auVar59._8_4_ = auVar92._0_4_;
      auVar59._12_4_ = auVar92._4_4_;
      auVar92 = minps(auVar59,auVar92);
      uVar32 = -(uint)(auVar92._0_4_ == auVar78._0_4_);
      uVar33 = -(uint)(auVar92._4_4_ == auVar78._4_4_);
      uVar34 = -(uint)(auVar92._8_4_ == auVar78._8_4_);
      uVar35 = -(uint)(auVar92._12_4_ == auVar78._12_4_);
      auVar79._0_4_ = uVar32 & uVar39;
      auVar79._4_4_ = uVar33 & uVar50;
      auVar79._8_4_ = uVar34 & uVar52;
      auVar79._12_4_ = uVar35 & uVar54;
      iVar18 = movmskps(iVar18,auVar79);
      uVar56 = 0xffffffff;
      uVar73 = 0xffffffff;
      uVar75 = 0xffffffff;
      uVar77 = 0xffffffff;
      if (iVar18 != 0) {
        uVar56 = uVar32;
        uVar73 = uVar33;
        uVar75 = uVar34;
        uVar77 = uVar35;
      }
      auVar41._0_4_ = uVar39 & uVar56;
      auVar41._4_4_ = uVar50 & uVar73;
      auVar41._8_4_ = uVar52 & uVar75;
      auVar41._12_4_ = uVar54 & uVar77;
      uVar56 = movmskps(iVar18,auVar41);
      lVar26 = 0;
      if (uVar56 != 0) {
        for (; (uVar56 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
        }
      }
      pauVar28 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      pSVar30 = local_200;
      fVar76 = fVar37;
      fVar90 = fVar37;
      fVar95 = fVar37;
      fVar55 = fVar108;
      fVar72 = fVar108;
      fVar74 = fVar108;
      fVar38 = fVar126;
      fVar51 = fVar126;
      fVar53 = fVar126;
      do {
        local_1f8.hit = (RTCHitN *)&local_c8;
        local_1f8.valid = (int *)local_238;
        local_68 = local_d8[lVar26];
        uVar21 = (ulong)local_68;
        pGVar9 = (pSVar30->geometries).items[uVar21].ptr;
        local_1f8.ray = (RTCRayN *)ray;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_248 + lVar26 * 4) = 0;
        }
        else {
          if ((pRVar17->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar49 = local_1b8[lVar26];
            uVar112 = 0;
            uVar113 = 0;
            uVar114 = 0;
            *(float *)(ray + k * 4 + 0x80) = fVar49;
            *(float *)(ray + k * 4 + 0xc0) = local_1a8[lVar26];
            *(float *)(ray + k * 4 + 0xd0) = local_198[lVar26];
            *(float *)(ray + k * 4 + 0xe0) = local_188[lVar26];
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar26];
            *(uint *)(ray + k * 4 + 0x120) = local_68;
            *(uint *)(ray + k * 4 + 0x130) = pRVar17->user->instID[0];
            uVar56 = pRVar17->user->instPrimID[0];
            uVar20 = 0;
            *(uint *)(ray + k * 4 + 0x140) = uVar56;
LAB_00ac1ffc:
            local_248._0_4_ = uVar91 & -(uint)(fVar89 <= fVar49) & auVar106._0_4_;
            local_248._4_4_ = uVar96 & -(uint)(fVar109 <= fVar49) & auVar106._4_4_;
            local_248._8_4_ = uVar98 & -(uint)(fVar110 <= fVar49) & auVar106._8_4_;
            local_248._12_4_ = uVar100 & -(uint)(fVar111 <= fVar49) & auVar106._12_4_;
            iVar18 = movmskps(uVar56,local_248);
            if (iVar18 == 0) {
              return;
            }
            fVar97 = auVar102._0_4_;
            fVar99 = auVar102._4_4_;
            fVar104 = auVar102._8_4_;
            fVar105 = auVar102._12_4_;
            local_1b8[0] = fVar89;
            local_1b8[1] = fVar109;
            local_1b8[2] = fVar110;
            local_1b8[3] = fVar111;
            local_1a8[0] = fVar37 * fVar97 - fVar119;
            local_1a8[1] = fVar76 * fVar99 - fVar120;
            local_1a8[2] = fVar90 * fVar104 - fVar121;
            local_1a8[3] = fVar95 * fVar105 - fVar36;
            local_198[0] = fVar108 * fVar97 - fVar115;
            local_198[1] = fVar55 * fVar99 - fVar116;
            local_198[2] = fVar72 * fVar104 - fVar117;
            local_198[3] = fVar74 * fVar105 - fVar118;
            local_188[0] = fVar126 * fVar97 - fVar122;
            local_188[1] = fVar38 * fVar99 - fVar123;
            local_188[2] = fVar51 * fVar104 - fVar124;
            local_188[3] = fVar53 * fVar105 - fVar125;
            auVar31 = (undefined1  [8])pRVar17->scene;
            auVar44._0_4_ = (uint)fVar89 & local_248._0_4_;
            auVar44._4_4_ = (uint)fVar109 & local_248._4_4_;
            auVar44._8_4_ = (uint)fVar110 & local_248._8_4_;
            auVar44._12_4_ = (uint)fVar111 & local_248._12_4_;
            auVar65._0_8_ = CONCAT44(~local_248._4_4_,~local_248._0_4_) & 0x7f8000007f800000;
            auVar65._8_4_ = ~local_248._8_4_ & 0x7f800000;
            auVar65._12_4_ = ~local_248._12_4_ & 0x7f800000;
            auVar65 = auVar65 | auVar44;
            auVar81._4_4_ = auVar65._0_4_;
            auVar81._0_4_ = auVar65._4_4_;
            auVar81._8_4_ = auVar65._12_4_;
            auVar81._12_4_ = auVar65._8_4_;
            auVar102 = minps(auVar81,auVar65);
            auVar45._0_8_ = auVar102._8_8_;
            auVar45._8_4_ = auVar102._0_4_;
            auVar45._12_4_ = auVar102._4_4_;
            auVar102 = minps(auVar45,auVar102);
            auVar46._0_8_ =
                 CONCAT44(-(uint)(auVar102._4_4_ == auVar65._4_4_) & local_248._4_4_,
                          -(uint)(auVar102._0_4_ == auVar65._0_4_) & local_248._0_4_);
            auVar46._8_4_ = -(uint)(auVar102._8_4_ == auVar65._8_4_) & local_248._8_4_;
            auVar46._12_4_ = -(uint)(auVar102._12_4_ == auVar65._12_4_) & local_248._12_4_;
            iVar18 = movmskps(iVar18,auVar46);
            auVar93 = local_248;
            if (iVar18 != 0) {
              auVar93._8_4_ = auVar46._8_4_;
              auVar93._0_8_ = auVar46._0_8_;
              auVar93._12_4_ = auVar46._12_4_;
            }
            uVar19 = movmskps(iVar18,auVar93);
            lVar26 = 0;
            if (CONCAT44(uVar20,uVar19) != 0) {
              for (; (CONCAT44(uVar20,uVar19) >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
              }
            }
            do {
              local_1f8.hit = (RTCHitN *)&local_c8;
              local_1f8.valid = (int *)local_238;
              local_68 = local_d8[lVar26];
              uVar21 = (ulong)local_68;
              pGVar9 = (((Scene *)auVar31)->geometries).items[uVar21].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_248 + lVar26 * 4) = 0;
              }
              else {
                if ((pRVar17->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = local_1b8[lVar26];
                  *(float *)(ray + k * 4 + 0xc0) = local_1a8[lVar26];
                  *(float *)(ray + k * 4 + 0xd0) = local_198[lVar26];
                  *(float *)(ray + k * 4 + 0xe0) = local_188[lVar26];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar26];
                  *(uint *)(ray + k * 4 + 0x120) = local_68;
                  *(uint *)(ray + k * 4 + 0x130) = pRVar17->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = pRVar17->user->instPrimID[0];
                  return;
                }
                local_78 = (sphere->primIDs).field_0.i[lVar26];
                local_c8 = local_1a8[lVar26];
                local_b8 = local_198[lVar26];
                fVar36 = local_188[lVar26];
                local_a8._4_4_ = fVar36;
                local_a8._0_4_ = fVar36;
                fStack_a0 = fVar36;
                fStack_9c = fVar36;
                fStack_c4 = local_c8;
                fStack_c0 = local_c8;
                fStack_bc = local_c8;
                fStack_b4 = local_b8;
                fStack_b0 = local_b8;
                fStack_ac = local_b8;
                local_88 = 0;
                uStack_80 = 0;
                local_98 = 0;
                uStack_90 = 0;
                uStack_74 = local_78;
                uStack_70 = local_78;
                uStack_6c = local_78;
                uStack_64 = local_68;
                uStack_60 = local_68;
                uStack_5c = local_68;
                local_58 = pRVar17->user->instID[0];
                uStack_54 = local_58;
                uStack_50 = local_58;
                uStack_4c = local_58;
                local_48 = pRVar17->user->instPrimID[0];
                uStack_44 = local_48;
                uStack_40 = local_48;
                uStack_3c = local_48;
                *(float *)(ray + k * 4 + 0x80) = local_1b8[lVar26];
                local_238 = *pauVar28;
                local_1f8.geometryUserPtr = pGVar9->userPtr;
                local_1f8.context = pRVar17->user;
                local_1f8.N = 4;
                p_Var22 = pGVar9->intersectionFilterN;
                local_218 = auVar31;
                local_228 = fVar89;
                fStack_224 = fVar109;
                fStack_220 = fVar110;
                fStack_21c = fVar111;
                local_1f8.ray = (RTCRayN *)ray;
                local_1c8 = fVar49;
                uStack_1c4 = uVar112;
                uStack_1c0 = uVar113;
                uStack_1bc = uVar114;
                if (p_Var22 != (RTCFilterFunctionN)0x0) {
                  local_208 = pauVar28;
                  p_Var22 = (RTCFilterFunctionN)(*p_Var22)(&local_1f8);
                  pauVar28 = local_208;
                  auVar31 = local_218;
                }
                auVar66._0_4_ = -(uint)(local_238._0_4_ == 0);
                auVar66._4_4_ = -(uint)(local_238._4_4_ == 0);
                auVar66._8_4_ = -(uint)(local_238._8_4_ == 0);
                auVar66._12_4_ = -(uint)(local_238._12_4_ == 0);
                uVar91 = movmskps((int)p_Var22,auVar66);
                pRVar23 = (RayHitK<4> *)(ulong)(uVar91 ^ 0xf);
                if ((uVar91 ^ 0xf) == 0) {
                  auVar12._8_4_ = 0xffffffff;
                  auVar12._0_8_ = 0xffffffffffffffff;
                  auVar12._12_4_ = 0xffffffff;
                  auVar67 = auVar66 ^ auVar12;
                  fVar89 = local_228;
                  fVar109 = fStack_224;
                  fVar110 = fStack_220;
                  fVar111 = fStack_21c;
                }
                else {
                  p_Var22 = pRVar17->args->filter;
                  if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                     (((pRVar17->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    p_Var22 = (RTCFilterFunctionN)(*p_Var22)(&local_1f8);
                    auVar31 = local_218;
                  }
                  auVar47._0_4_ = -(uint)(local_238._0_4_ == 0);
                  auVar47._4_4_ = -(uint)(local_238._4_4_ == 0);
                  auVar47._8_4_ = -(uint)(local_238._8_4_ == 0);
                  auVar47._12_4_ = -(uint)(local_238._12_4_ == 0);
                  auVar67._8_4_ = 0xffffffff;
                  auVar67._0_8_ = 0xffffffffffffffff;
                  auVar67._12_4_ = 0xffffffff;
                  auVar67 = auVar47 ^ auVar67;
                  uVar91 = movmskps((int)p_Var22,auVar47);
                  pRVar23 = (RayHitK<4> *)(ulong)(uVar91 ^ 0xf);
                  fVar89 = local_228;
                  fVar109 = fStack_224;
                  fVar110 = fStack_220;
                  fVar111 = fStack_21c;
                  if ((uVar91 ^ 0xf) != 0) {
                    auVar82._0_4_ = *(uint *)(local_1f8.ray + 0xc0) & auVar47._0_4_;
                    auVar82._4_4_ = *(uint *)(local_1f8.ray + 0xc4) & auVar47._4_4_;
                    auVar82._8_4_ = *(uint *)(local_1f8.ray + 200) & auVar47._8_4_;
                    auVar82._12_4_ = *(uint *)(local_1f8.ray + 0xcc) & auVar47._12_4_;
                    auVar107._0_4_ = ~auVar47._0_4_ & (uint)*(float *)local_1f8.hit;
                    auVar107._4_4_ = ~auVar47._4_4_ & (uint)*(float *)(local_1f8.hit + 4);
                    auVar107._8_4_ = ~auVar47._8_4_ & (uint)*(float *)(local_1f8.hit + 8);
                    auVar107._12_4_ = ~auVar47._12_4_ & (uint)*(float *)(local_1f8.hit + 0xc);
                    *(undefined1 (*) [16])(local_1f8.ray + 0xc0) = auVar107 | auVar82;
                    fVar36 = *(float *)(local_1f8.hit + 0x14);
                    fVar118 = *(float *)(local_1f8.hit + 0x18);
                    fVar125 = *(float *)(local_1f8.hit + 0x1c);
                    *(uint *)(local_1f8.ray + 0xd0) =
                         ~auVar47._0_4_ & (uint)*(float *)(local_1f8.hit + 0x10) |
                         *(uint *)(local_1f8.ray + 0xd0) & auVar47._0_4_;
                    *(uint *)(local_1f8.ray + 0xd4) =
                         ~auVar47._4_4_ & (uint)fVar36 |
                         *(uint *)(local_1f8.ray + 0xd4) & auVar47._4_4_;
                    *(uint *)(local_1f8.ray + 0xd8) =
                         ~auVar47._8_4_ & (uint)fVar118 |
                         *(uint *)(local_1f8.ray + 0xd8) & auVar47._8_4_;
                    *(uint *)(local_1f8.ray + 0xdc) =
                         ~auVar47._12_4_ & (uint)fVar125 |
                         *(uint *)(local_1f8.ray + 0xdc) & auVar47._12_4_;
                    auVar94._0_4_ = *(uint *)(local_1f8.ray + 0xe0) & auVar47._0_4_;
                    auVar94._4_4_ = *(uint *)(local_1f8.ray + 0xe4) & auVar47._4_4_;
                    auVar94._8_4_ = *(uint *)(local_1f8.ray + 0xe8) & auVar47._8_4_;
                    auVar94._12_4_ = *(uint *)(local_1f8.ray + 0xec) & auVar47._12_4_;
                    auVar83._0_4_ = ~auVar47._0_4_ & (uint)*(float *)(local_1f8.hit + 0x20);
                    auVar83._4_4_ = ~auVar47._4_4_ & (uint)*(float *)(local_1f8.hit + 0x24);
                    auVar83._8_4_ = ~auVar47._8_4_ & (uint)*(float *)(local_1f8.hit + 0x28);
                    auVar83._12_4_ = ~auVar47._12_4_ & (uint)*(float *)(local_1f8.hit + 0x2c);
                    *(undefined1 (*) [16])(local_1f8.ray + 0xe0) = auVar83 | auVar94;
                    auVar103._0_4_ = *(uint *)(local_1f8.ray + 0xf0) & auVar47._0_4_;
                    auVar103._4_4_ = *(uint *)(local_1f8.ray + 0xf4) & auVar47._4_4_;
                    auVar103._8_4_ = *(uint *)(local_1f8.ray + 0xf8) & auVar47._8_4_;
                    auVar103._12_4_ = *(uint *)(local_1f8.ray + 0xfc) & auVar47._12_4_;
                    auVar84._0_4_ = ~auVar47._0_4_ & (uint)*(float *)(local_1f8.hit + 0x30);
                    auVar84._4_4_ = ~auVar47._4_4_ & (uint)*(float *)(local_1f8.hit + 0x34);
                    auVar84._8_4_ = ~auVar47._8_4_ & (uint)*(float *)(local_1f8.hit + 0x38);
                    auVar84._12_4_ = ~auVar47._12_4_ & (uint)*(float *)(local_1f8.hit + 0x3c);
                    *(undefined1 (*) [16])(local_1f8.ray + 0xf0) = auVar84 | auVar103;
                    fVar36 = *(float *)(local_1f8.hit + 0x44);
                    fVar118 = *(float *)(local_1f8.hit + 0x48);
                    fVar125 = *(float *)(local_1f8.hit + 0x4c);
                    *(uint *)(local_1f8.ray + 0x100) =
                         ~auVar47._0_4_ & (uint)*(float *)(local_1f8.hit + 0x40) |
                         *(uint *)(local_1f8.ray + 0x100) & auVar47._0_4_;
                    *(uint *)(local_1f8.ray + 0x104) =
                         ~auVar47._4_4_ & (uint)fVar36 |
                         *(uint *)(local_1f8.ray + 0x104) & auVar47._4_4_;
                    *(uint *)(local_1f8.ray + 0x108) =
                         ~auVar47._8_4_ & (uint)fVar118 |
                         *(uint *)(local_1f8.ray + 0x108) & auVar47._8_4_;
                    *(uint *)(local_1f8.ray + 0x10c) =
                         ~auVar47._12_4_ & (uint)fVar125 |
                         *(uint *)(local_1f8.ray + 0x10c) & auVar47._12_4_;
                    fVar36 = *(float *)(local_1f8.hit + 0x54);
                    fVar118 = *(float *)(local_1f8.hit + 0x58);
                    fVar125 = *(float *)(local_1f8.hit + 0x5c);
                    *(uint *)(local_1f8.ray + 0x110) =
                         *(uint *)(local_1f8.ray + 0x110) & auVar47._0_4_ |
                         ~auVar47._0_4_ & (uint)*(float *)(local_1f8.hit + 0x50);
                    *(uint *)(local_1f8.ray + 0x114) =
                         *(uint *)(local_1f8.ray + 0x114) & auVar47._4_4_ |
                         ~auVar47._4_4_ & (uint)fVar36;
                    *(uint *)(local_1f8.ray + 0x118) =
                         *(uint *)(local_1f8.ray + 0x118) & auVar47._8_4_ |
                         ~auVar47._8_4_ & (uint)fVar118;
                    *(uint *)(local_1f8.ray + 0x11c) =
                         *(uint *)(local_1f8.ray + 0x11c) & auVar47._12_4_ |
                         ~auVar47._12_4_ & (uint)fVar125;
                    fVar36 = *(float *)(local_1f8.hit + 100);
                    fVar118 = *(float *)(local_1f8.hit + 0x68);
                    fVar125 = *(float *)(local_1f8.hit + 0x6c);
                    *(uint *)(local_1f8.ray + 0x120) =
                         *(uint *)(local_1f8.ray + 0x120) & auVar47._0_4_ |
                         ~auVar47._0_4_ & (uint)*(float *)(local_1f8.hit + 0x60);
                    *(uint *)(local_1f8.ray + 0x124) =
                         *(uint *)(local_1f8.ray + 0x124) & auVar47._4_4_ |
                         ~auVar47._4_4_ & (uint)fVar36;
                    *(uint *)(local_1f8.ray + 0x128) =
                         *(uint *)(local_1f8.ray + 0x128) & auVar47._8_4_ |
                         ~auVar47._8_4_ & (uint)fVar118;
                    *(uint *)(local_1f8.ray + 300) =
                         *(uint *)(local_1f8.ray + 300) & auVar47._12_4_ |
                         ~auVar47._12_4_ & (uint)fVar125;
                    fVar36 = *(float *)(local_1f8.hit + 0x74);
                    fVar118 = *(float *)(local_1f8.hit + 0x78);
                    fVar125 = *(float *)(local_1f8.hit + 0x7c);
                    *(uint *)(local_1f8.ray + 0x130) =
                         ~auVar47._0_4_ & (uint)*(float *)(local_1f8.hit + 0x70) |
                         *(uint *)(local_1f8.ray + 0x130) & auVar47._0_4_;
                    *(uint *)(local_1f8.ray + 0x134) =
                         ~auVar47._4_4_ & (uint)fVar36 |
                         *(uint *)(local_1f8.ray + 0x134) & auVar47._4_4_;
                    *(uint *)(local_1f8.ray + 0x138) =
                         ~auVar47._8_4_ & (uint)fVar118 |
                         *(uint *)(local_1f8.ray + 0x138) & auVar47._8_4_;
                    *(uint *)(local_1f8.ray + 0x13c) =
                         ~auVar47._12_4_ & (uint)fVar125 |
                         *(uint *)(local_1f8.ray + 0x13c) & auVar47._12_4_;
                    *(undefined1 (*) [16])(local_1f8.ray + 0x140) =
                         ~auVar47 & *(undefined1 (*) [16])(local_1f8.hit + 0x80) |
                         *(undefined1 (*) [16])(local_1f8.ray + 0x140) & auVar47;
                    pRVar23 = (RayHitK<4> *)local_1f8.ray;
                  }
                }
                auVar71._0_4_ = auVar67._0_4_ << 0x1f;
                auVar71._4_4_ = auVar67._4_4_ << 0x1f;
                auVar71._8_4_ = auVar67._8_4_ << 0x1f;
                auVar71._12_4_ = auVar67._12_4_ << 0x1f;
                iVar18 = movmskps((int)pRVar23,auVar71);
                uVar21 = CONCAT44((int)((ulong)pRVar23 >> 0x20),iVar18);
                if (iVar18 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = local_1c8;
                  fVar49 = local_1c8;
                  uVar112 = uStack_1c4;
                  uVar113 = uStack_1c0;
                  uVar114 = uStack_1bc;
                }
                else {
                  fVar49 = *(float *)(ray + k * 4 + 0x80);
                  uVar112 = 0;
                  uVar113 = 0;
                  uVar114 = 0;
                }
                *(undefined4 *)(local_248 + lVar26 * 4) = 0;
                local_248._0_4_ = -(uint)(fVar89 <= fVar49) & local_248._0_4_;
                local_248._4_4_ = -(uint)(fVar109 <= fVar49) & local_248._4_4_;
                local_248._8_4_ = -(uint)(fVar110 <= fVar49) & local_248._8_4_;
                local_248._12_4_ = -(uint)(fVar111 <= fVar49) & local_248._12_4_;
              }
              iVar18 = movmskps((int)uVar21,local_248);
              if (iVar18 == 0) {
                return;
              }
              uVar91 = local_248._0_4_;
              uVar96 = local_248._4_4_;
              uVar98 = local_248._8_4_;
              uVar100 = local_248._12_4_;
              auVar68._0_4_ = uVar91 & (uint)fVar89;
              auVar68._4_4_ = uVar96 & (uint)fVar109;
              auVar68._8_4_ = uVar98 & (uint)fVar110;
              auVar68._12_4_ = uVar100 & (uint)fVar111;
              auVar85._0_8_ = CONCAT44(~uVar96,~uVar91) & 0x7f8000007f800000;
              auVar85._8_4_ = ~uVar98 & 0x7f800000;
              auVar85._12_4_ = ~uVar100 & 0x7f800000;
              auVar85 = auVar85 | auVar68;
              auVar88._4_4_ = auVar85._0_4_;
              auVar88._0_4_ = auVar85._4_4_;
              auVar88._8_4_ = auVar85._12_4_;
              auVar88._12_4_ = auVar85._8_4_;
              auVar102 = minps(auVar88,auVar85);
              auVar69._0_8_ = auVar102._8_8_;
              auVar69._8_4_ = auVar102._0_4_;
              auVar69._12_4_ = auVar102._4_4_;
              auVar102 = minps(auVar69,auVar102);
              auVar70._0_8_ =
                   CONCAT44(-(uint)(auVar102._4_4_ == auVar85._4_4_) & uVar96,
                            -(uint)(auVar102._0_4_ == auVar85._0_4_) & uVar91);
              auVar70._8_4_ = -(uint)(auVar102._8_4_ == auVar85._8_4_) & uVar98;
              auVar70._12_4_ = -(uint)(auVar102._12_4_ == auVar85._12_4_) & uVar100;
              iVar18 = movmskps(iVar18,auVar70);
              auVar48 = local_248;
              if (iVar18 != 0) {
                auVar48._8_4_ = auVar70._8_4_;
                auVar48._0_8_ = auVar70._0_8_;
                auVar48._12_4_ = auVar70._12_4_;
              }
              uVar20 = movmskps(iVar18,auVar48);
              uVar21 = CONCAT44((int)(uVar21 >> 0x20),uVar20);
              lVar26 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                }
              }
            } while( true );
          }
          local_178 = uVar91;
          uStack_174 = uVar96;
          uStack_170 = uVar98;
          uStack_16c = uVar100;
          local_78 = (sphere->primIDs).field_0.i[lVar26];
          local_c8 = local_1a8[lVar26];
          local_b8 = local_198[lVar26];
          local_a8._4_4_ = local_188[lVar26];
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          local_a8._0_4_ = local_a8._4_4_;
          fStack_a0 = (float)local_a8._4_4_;
          fStack_9c = (float)local_a8._4_4_;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          local_58 = pRVar17->user->instID[0];
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          local_48 = pRVar17->user->instPrimID[0];
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          *(float *)(ray + k * 4 + 0x80) = local_1b8[lVar26];
          local_238 = *pauVar28;
          local_1f8.geometryUserPtr = pGVar9->userPtr;
          local_1f8.context = pRVar17->user;
          local_1f8.N = 4;
          p_Var22 = pGVar9->intersectionFilterN;
          local_e8 = fVar115;
          fStack_e4 = fVar116;
          fStack_e0 = fVar117;
          fStack_dc = fVar118;
          local_f8 = fVar119;
          fStack_f4 = fVar120;
          fStack_f0 = fVar121;
          fStack_ec = fVar36;
          local_108 = fVar122;
          fStack_104 = fVar123;
          fStack_100 = fVar124;
          fStack_fc = fVar125;
          local_118 = fVar37;
          fStack_114 = fVar76;
          fStack_110 = fVar90;
          fStack_10c = fVar95;
          local_128 = fVar108;
          fStack_124 = fVar55;
          fStack_120 = fVar72;
          fStack_11c = fVar74;
          local_138 = fVar126;
          fStack_134 = fVar38;
          fStack_130 = fVar51;
          fStack_12c = fVar53;
          local_158 = auVar102;
          local_168 = auVar106;
          local_228 = fVar89;
          fStack_224 = fVar109;
          fStack_220 = fVar110;
          fStack_21c = fVar111;
          local_1c8 = fVar49;
          uStack_1c4 = uVar112;
          uStack_1c0 = uVar113;
          uStack_1bc = uVar114;
          if (p_Var22 != (RTCFilterFunctionN)0x0) {
            local_208 = pauVar28;
            p_Var22 = (RTCFilterFunctionN)(*p_Var22)(&local_1f8);
            pauVar28 = local_208;
            pSVar30 = local_200;
          }
          auVar60._0_4_ = -(uint)(local_238._0_4_ == 0);
          auVar60._4_4_ = -(uint)(local_238._4_4_ == 0);
          auVar60._8_4_ = -(uint)(local_238._8_4_ == 0);
          auVar60._12_4_ = -(uint)(local_238._12_4_ == 0);
          uVar91 = movmskps((int)p_Var22,auVar60);
          pRVar23 = (RayHitK<4> *)(ulong)(uVar91 ^ 0xf);
          if ((uVar91 ^ 0xf) == 0) {
            auVar60 = auVar60 ^ _DAT_01f7ae20;
            fVar89 = local_228;
            fVar109 = fStack_224;
            fVar110 = fStack_220;
            fVar111 = fStack_21c;
          }
          else {
            p_Var22 = pRVar17->args->filter;
            if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
               (((pRVar17->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              p_Var22 = (RTCFilterFunctionN)(*p_Var22)(&local_1f8);
              pSVar30 = local_200;
            }
            auVar42._0_4_ = -(uint)(local_238._0_4_ == 0);
            auVar42._4_4_ = -(uint)(local_238._4_4_ == 0);
            auVar42._8_4_ = -(uint)(local_238._8_4_ == 0);
            auVar42._12_4_ = -(uint)(local_238._12_4_ == 0);
            auVar60 = auVar42 ^ _DAT_01f7ae20;
            uVar91 = movmskps((int)p_Var22,auVar42);
            pRVar23 = (RayHitK<4> *)(ulong)(uVar91 ^ 0xf);
            fVar89 = local_228;
            fVar109 = fStack_224;
            fVar110 = fStack_220;
            fVar111 = fStack_21c;
            if ((uVar91 ^ 0xf) != 0) {
              fVar36 = *(float *)(local_1f8.hit + 4);
              fVar118 = *(float *)(local_1f8.hit + 8);
              fVar125 = *(float *)(local_1f8.hit + 0xc);
              *(uint *)(local_1f8.ray + 0xc0) =
                   ~auVar42._0_4_ & (uint)*(float *)local_1f8.hit |
                   *(uint *)(local_1f8.ray + 0xc0) & auVar42._0_4_;
              *(uint *)(local_1f8.ray + 0xc4) =
                   ~auVar42._4_4_ & (uint)fVar36 | *(uint *)(local_1f8.ray + 0xc4) & auVar42._4_4_;
              *(uint *)(local_1f8.ray + 200) =
                   ~auVar42._8_4_ & (uint)fVar118 | *(uint *)(local_1f8.ray + 200) & auVar42._8_4_;
              *(uint *)(local_1f8.ray + 0xcc) =
                   ~auVar42._12_4_ & (uint)fVar125 |
                   *(uint *)(local_1f8.ray + 0xcc) & auVar42._12_4_;
              fVar36 = *(float *)(local_1f8.hit + 0x14);
              fVar118 = *(float *)(local_1f8.hit + 0x18);
              fVar125 = *(float *)(local_1f8.hit + 0x1c);
              *(uint *)(local_1f8.ray + 0xd0) =
                   ~auVar42._0_4_ & (uint)*(float *)(local_1f8.hit + 0x10) |
                   *(uint *)(local_1f8.ray + 0xd0) & auVar42._0_4_;
              *(uint *)(local_1f8.ray + 0xd4) =
                   ~auVar42._4_4_ & (uint)fVar36 | *(uint *)(local_1f8.ray + 0xd4) & auVar42._4_4_;
              *(uint *)(local_1f8.ray + 0xd8) =
                   ~auVar42._8_4_ & (uint)fVar118 | *(uint *)(local_1f8.ray + 0xd8) & auVar42._8_4_;
              *(uint *)(local_1f8.ray + 0xdc) =
                   ~auVar42._12_4_ & (uint)fVar125 |
                   *(uint *)(local_1f8.ray + 0xdc) & auVar42._12_4_;
              fVar36 = *(float *)(local_1f8.hit + 0x24);
              fVar118 = *(float *)(local_1f8.hit + 0x28);
              fVar125 = *(float *)(local_1f8.hit + 0x2c);
              *(uint *)(local_1f8.ray + 0xe0) =
                   ~auVar42._0_4_ & (uint)*(float *)(local_1f8.hit + 0x20) |
                   *(uint *)(local_1f8.ray + 0xe0) & auVar42._0_4_;
              *(uint *)(local_1f8.ray + 0xe4) =
                   ~auVar42._4_4_ & (uint)fVar36 | *(uint *)(local_1f8.ray + 0xe4) & auVar42._4_4_;
              *(uint *)(local_1f8.ray + 0xe8) =
                   ~auVar42._8_4_ & (uint)fVar118 | *(uint *)(local_1f8.ray + 0xe8) & auVar42._8_4_;
              *(uint *)(local_1f8.ray + 0xec) =
                   ~auVar42._12_4_ & (uint)fVar125 |
                   *(uint *)(local_1f8.ray + 0xec) & auVar42._12_4_;
              fVar36 = *(float *)(local_1f8.hit + 0x34);
              fVar118 = *(float *)(local_1f8.hit + 0x38);
              fVar125 = *(float *)(local_1f8.hit + 0x3c);
              *(uint *)(local_1f8.ray + 0xf0) =
                   ~auVar42._0_4_ & (uint)*(float *)(local_1f8.hit + 0x30) |
                   *(uint *)(local_1f8.ray + 0xf0) & auVar42._0_4_;
              *(uint *)(local_1f8.ray + 0xf4) =
                   ~auVar42._4_4_ & (uint)fVar36 | *(uint *)(local_1f8.ray + 0xf4) & auVar42._4_4_;
              *(uint *)(local_1f8.ray + 0xf8) =
                   ~auVar42._8_4_ & (uint)fVar118 | *(uint *)(local_1f8.ray + 0xf8) & auVar42._8_4_;
              *(uint *)(local_1f8.ray + 0xfc) =
                   ~auVar42._12_4_ & (uint)fVar125 |
                   *(uint *)(local_1f8.ray + 0xfc) & auVar42._12_4_;
              fVar36 = *(float *)(local_1f8.hit + 0x44);
              fVar118 = *(float *)(local_1f8.hit + 0x48);
              fVar125 = *(float *)(local_1f8.hit + 0x4c);
              *(uint *)(local_1f8.ray + 0x100) =
                   ~auVar42._0_4_ & (uint)*(float *)(local_1f8.hit + 0x40) |
                   *(uint *)(local_1f8.ray + 0x100) & auVar42._0_4_;
              *(uint *)(local_1f8.ray + 0x104) =
                   ~auVar42._4_4_ & (uint)fVar36 | *(uint *)(local_1f8.ray + 0x104) & auVar42._4_4_;
              *(uint *)(local_1f8.ray + 0x108) =
                   ~auVar42._8_4_ & (uint)fVar118 | *(uint *)(local_1f8.ray + 0x108) & auVar42._8_4_
              ;
              *(uint *)(local_1f8.ray + 0x10c) =
                   ~auVar42._12_4_ & (uint)fVar125 |
                   *(uint *)(local_1f8.ray + 0x10c) & auVar42._12_4_;
              fVar36 = *(float *)(local_1f8.hit + 0x54);
              fVar118 = *(float *)(local_1f8.hit + 0x58);
              fVar125 = *(float *)(local_1f8.hit + 0x5c);
              *(uint *)(local_1f8.ray + 0x110) =
                   *(uint *)(local_1f8.ray + 0x110) & auVar42._0_4_ |
                   ~auVar42._0_4_ & (uint)*(float *)(local_1f8.hit + 0x50);
              *(uint *)(local_1f8.ray + 0x114) =
                   *(uint *)(local_1f8.ray + 0x114) & auVar42._4_4_ | ~auVar42._4_4_ & (uint)fVar36;
              *(uint *)(local_1f8.ray + 0x118) =
                   *(uint *)(local_1f8.ray + 0x118) & auVar42._8_4_ | ~auVar42._8_4_ & (uint)fVar118
              ;
              *(uint *)(local_1f8.ray + 0x11c) =
                   *(uint *)(local_1f8.ray + 0x11c) & auVar42._12_4_ |
                   ~auVar42._12_4_ & (uint)fVar125;
              fVar36 = *(float *)(local_1f8.hit + 100);
              fVar118 = *(float *)(local_1f8.hit + 0x68);
              fVar125 = *(float *)(local_1f8.hit + 0x6c);
              *(uint *)(local_1f8.ray + 0x120) =
                   *(uint *)(local_1f8.ray + 0x120) & auVar42._0_4_ |
                   ~auVar42._0_4_ & (uint)*(float *)(local_1f8.hit + 0x60);
              *(uint *)(local_1f8.ray + 0x124) =
                   *(uint *)(local_1f8.ray + 0x124) & auVar42._4_4_ | ~auVar42._4_4_ & (uint)fVar36;
              *(uint *)(local_1f8.ray + 0x128) =
                   *(uint *)(local_1f8.ray + 0x128) & auVar42._8_4_ | ~auVar42._8_4_ & (uint)fVar118
              ;
              *(uint *)(local_1f8.ray + 300) =
                   *(uint *)(local_1f8.ray + 300) & auVar42._12_4_ | ~auVar42._12_4_ & (uint)fVar125
              ;
              fVar36 = *(float *)(local_1f8.hit + 0x74);
              fVar118 = *(float *)(local_1f8.hit + 0x78);
              fVar125 = *(float *)(local_1f8.hit + 0x7c);
              *(uint *)(local_1f8.ray + 0x130) =
                   ~auVar42._0_4_ & (uint)*(float *)(local_1f8.hit + 0x70) |
                   *(uint *)(local_1f8.ray + 0x130) & auVar42._0_4_;
              *(uint *)(local_1f8.ray + 0x134) =
                   ~auVar42._4_4_ & (uint)fVar36 | *(uint *)(local_1f8.ray + 0x134) & auVar42._4_4_;
              *(uint *)(local_1f8.ray + 0x138) =
                   ~auVar42._8_4_ & (uint)fVar118 | *(uint *)(local_1f8.ray + 0x138) & auVar42._8_4_
              ;
              *(uint *)(local_1f8.ray + 0x13c) =
                   ~auVar42._12_4_ & (uint)fVar125 |
                   *(uint *)(local_1f8.ray + 0x13c) & auVar42._12_4_;
              *(undefined1 (*) [16])(local_1f8.ray + 0x140) =
                   ~auVar42 & *(undefined1 (*) [16])(local_1f8.hit + 0x80) |
                   *(undefined1 (*) [16])(local_1f8.ray + 0x140) & auVar42;
              pRVar23 = (RayHitK<4> *)local_1f8.ray;
            }
          }
          fVar118 = fStack_dc;
          fVar117 = fStack_e0;
          fVar116 = fStack_e4;
          fVar115 = local_e8;
          fVar36 = fStack_ec;
          fVar121 = fStack_f0;
          fVar120 = fStack_f4;
          fVar119 = local_f8;
          fVar125 = fStack_fc;
          fVar124 = fStack_100;
          fVar123 = fStack_104;
          fVar122 = local_108;
          fVar95 = fStack_10c;
          fVar90 = fStack_110;
          fVar76 = fStack_114;
          fVar37 = local_118;
          fVar74 = fStack_11c;
          fVar72 = fStack_120;
          fVar55 = fStack_124;
          fVar108 = local_128;
          fVar53 = fStack_12c;
          fVar51 = fStack_130;
          fVar38 = fStack_134;
          fVar126 = local_138;
          auVar102 = local_158;
          auVar106 = local_168;
          uVar100 = uStack_16c;
          uVar98 = uStack_170;
          uVar96 = uStack_174;
          uVar91 = local_178;
          auVar64._0_4_ = auVar60._0_4_ << 0x1f;
          auVar64._4_4_ = auVar60._4_4_ << 0x1f;
          auVar64._8_4_ = auVar60._8_4_ << 0x1f;
          auVar64._12_4_ = auVar60._12_4_ << 0x1f;
          iVar18 = movmskps((int)pRVar23,auVar64);
          uVar21 = CONCAT44((int)((ulong)pRVar23 >> 0x20),iVar18);
          if (iVar18 == 0) {
            *(float *)(ray + k * 4 + 0x80) = local_1c8;
            fVar49 = local_1c8;
            uVar112 = uStack_1c4;
            uVar113 = uStack_1c0;
            uVar114 = uStack_1bc;
          }
          else {
            fVar49 = *(float *)(ray + k * 4 + 0x80);
            uVar112 = 0;
            uVar113 = 0;
            uVar114 = 0;
          }
          *(undefined4 *)(local_248 + lVar26 * 4) = 0;
          local_248._0_4_ = -(uint)((float)local_218._0_4_ <= fVar49) & local_248._0_4_;
          local_248._4_4_ = -(uint)((float)local_218._4_4_ <= fVar49) & local_248._4_4_;
          local_248._8_4_ = -(uint)(fStack_210 <= fVar49) & local_248._8_4_;
          local_248._12_4_ = -(uint)(fStack_20c <= fVar49) & local_248._12_4_;
        }
        uVar20 = (undefined4)(uVar21 >> 0x20);
        uVar56 = movmskps((int)uVar21,local_248);
        if (uVar56 == 0) goto LAB_00ac1ffc;
        uVar73 = local_248._0_4_;
        uVar75 = local_248._4_4_;
        uVar77 = local_248._8_4_;
        uVar32 = local_248._12_4_;
        auVar61._0_4_ = uVar73 & local_218._0_4_;
        auVar61._4_4_ = uVar75 & local_218._4_4_;
        auVar61._8_4_ = uVar77 & (uint)fStack_210;
        auVar61._12_4_ = uVar32 & (uint)fStack_20c;
        auVar80._0_8_ = CONCAT44(~uVar75,~uVar73) & 0x7f8000007f800000;
        auVar80._8_4_ = ~uVar77 & 0x7f800000;
        auVar80._12_4_ = ~uVar32 & 0x7f800000;
        auVar80 = auVar80 | auVar61;
        auVar87._4_4_ = auVar80._0_4_;
        auVar87._0_4_ = auVar80._4_4_;
        auVar87._8_4_ = auVar80._12_4_;
        auVar87._12_4_ = auVar80._8_4_;
        auVar92 = minps(auVar87,auVar80);
        auVar62._0_8_ = auVar92._8_8_;
        auVar62._8_4_ = auVar92._0_4_;
        auVar62._12_4_ = auVar92._4_4_;
        auVar92 = minps(auVar62,auVar92);
        auVar63._0_8_ =
             CONCAT44(-(uint)(auVar92._4_4_ == auVar80._4_4_) & uVar75,
                      -(uint)(auVar92._0_4_ == auVar80._0_4_) & uVar73);
        auVar63._8_4_ = -(uint)(auVar92._8_4_ == auVar80._8_4_) & uVar77;
        auVar63._12_4_ = -(uint)(auVar92._12_4_ == auVar80._12_4_) & uVar32;
        iVar18 = movmskps(uVar56,auVar63);
        auVar43 = local_248;
        if (iVar18 != 0) {
          auVar43._8_4_ = auVar63._8_4_;
          auVar43._0_8_ = auVar63._0_8_;
          auVar43._12_4_ = auVar63._12_4_;
        }
        uVar19 = movmskps(iVar18,auVar43);
        lVar26 = 0;
        if (CONCAT44(uVar20,uVar19) != 0) {
          for (; (CONCAT44(uVar20,uVar19) >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }